

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ElabSystemTaskSymbol::reportStaticAssert
          (ElabSystemTaskSymbol *this,Scope *scope,SourceLocation loc,string_view message,
          Expression *condition)

{
  ConstantValue *arg;
  ConstantValue *arg_00;
  bool bVar1;
  Diagnostic *pDVar2;
  BinaryExpressionSyntax *pBVar3;
  SourceLocation noteLocation;
  int *piVar4;
  string_view arg_01;
  string local_50;
  
  piVar4 = (int *)message._M_str;
  if (((piVar4 != (int *)0x0) && (*(ConstantValue **)(piVar4 + 4) != (ConstantValue *)0x0)) &&
     (bVar1 = ConstantValue::isTrue(*(ConstantValue **)(piVar4 + 4)), bVar1)) {
    return;
  }
  pDVar2 = Scope::addDiag((Scope *)this,(DiagCode)0x8f0006,(SourceLocation)scope);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,message._M_len,(long)loc + message._M_len);
  pDVar2 = Diagnostic::addStringAllowEmpty(pDVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (((piVar4 != (int *)0x0) && (*piVar4 == 0xb)) && (piVar4[0xc] - 9U < 10)) {
    if (*(SyntaxNode **)(piVar4 + 6) == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("expr.syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x29b,"void slang::ast::reduceComparison(const BinaryExpression &, Diagnostic &)")
      ;
    }
    pBVar3 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>
                       (*(SyntaxNode **)(piVar4 + 6));
    arg = *(ConstantValue **)(*(long *)(piVar4 + 0xe) + 0x10);
    if ((arg == (ConstantValue *)0x0) ||
       (arg_00 = *(ConstantValue **)(*(long *)(piVar4 + 0x10) + 0x10),
       arg_00 == (ConstantValue *)0x0)) {
      assert::assertFailed
                ("lc && rc",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x2a0,"void slang::ast::reduceComparison(const BinaryExpression &, Diagnostic &)")
      ;
    }
    noteLocation = parsing::Token::location(&pBVar3->operatorToken);
    pDVar2 = Diagnostic::addNote(pDVar2,(DiagCode)0xa70006,noteLocation);
    Diagnostic::operator<<(pDVar2,*(SourceRange *)(piVar4 + 8));
    pDVar2 = Diagnostic::operator<<(pDVar2,arg);
    arg_01 = parsing::Token::rawText(&pBVar3->operatorToken);
    pDVar2 = Diagnostic::operator<<(pDVar2,arg_01);
    Diagnostic::operator<<(pDVar2,arg_00);
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::reportStaticAssert(const Scope& scope, SourceLocation loc,
                                              string_view message, const Expression* condition) {
    if (condition && condition->constant) {
        // Issue no diagnostic if the assert condition is true.
        if (condition->constant->isTrue())
            return;
    }

    auto& diag = scope.addDiag(diag::StaticAssert, loc).addStringAllowEmpty(std::string(message));

    // If the condition is a comparison operator, note the value of both
    // sides to provide more info about why the assertion failed.
    if (condition && condition->kind == ExpressionKind::BinaryOp)
        reduceComparison(condition->as<BinaryExpression>(), diag);
}